

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdGetModifiedTxByHandle(void *handle,void *tx_data_handle,char **tx_hex_string)

{
  undefined8 uVar1;
  char *pcVar2;
  undefined8 *in_RDX;
  long in_RSI;
  CfdException *except;
  exception *std_except;
  ConfidentialTransactionContext *tx_1;
  TransactionContext *tx;
  bool is_bitcoin;
  string base_tx;
  CfdCapiTransactionData *tx_data;
  int result;
  string *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffe80;
  CfdException *this;
  bool *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  string local_120;
  AbstractTransaction *local_100;
  undefined1 local_f2;
  undefined1 local_f1 [41];
  string local_c8 [38];
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [8];
  string *in_stack_ffffffffffffff68;
  void *in_stack_ffffffffffffff70;
  CfdSourceLocation local_80;
  long local_68;
  allocator local_59;
  string local_58 [52];
  undefined4 local_24;
  undefined8 *local_20;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  local_24 = 0xffffffff;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"TransactionData",&local_59);
  cfd::capi::CheckBuffer(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_68 = local_18;
  if (local_20 == (undefined8 *)0x0) {
    local_80.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_80.filename = local_80.filename + 1;
    local_80.line = 0xde5;
    local_80.funcname = "CfdGetModifiedTxByHandle";
    cfd::core::logger::warn<>(&local_80,"tx hex string is null.");
    local_a2 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"Failed to parameter. tx hex string is null.",&local_a1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe80,error_code,in_stack_fffffffffffffe70);
    local_a2 = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::__cxx11::string::string(local_c8);
  local_f1[0x28] = 0;
  cfd::capi::ConvertNetType(in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8);
  if (*(long *)(local_68 + 0x18) == 0) {
    local_f2 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    this = (CfdException *)local_f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_f1 + 1),"Invalid handle state. tx is null",(allocator *)this);
    cfd::core::CfdException::CfdException
              (this,(CfdError)((ulong)uVar1 >> 0x20),in_stack_fffffffffffffe70);
    local_f2 = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((local_f1[0x28] & 1) == 0) {
    cfd::core::AbstractTransaction::GetHex_abi_cxx11_
              ((string *)&stack0xfffffffffffffeb8,*(AbstractTransaction **)(local_68 + 0x18));
    pcVar2 = cfd::capi::CreateString
                       ((string *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    *local_20 = pcVar2;
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
  }
  else {
    local_100 = *(AbstractTransaction **)(local_68 + 0x18);
    cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_120,local_100);
    pcVar2 = cfd::capi::CreateString
                       ((string *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    *local_20 = pcVar2;
    std::__cxx11::string::~string((string *)&local_120);
  }
  local_4 = 0;
  std::__cxx11::string::~string(local_c8);
  return local_4;
}

Assistant:

int CfdGetModifiedTxByHandle(
    void* handle, void* tx_data_handle, char** tx_hex_string) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);
    if (tx_hex_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx hex string is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx hex string is null.");
    }

    std::string base_tx;
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      *tx_hex_string = CreateString(tx->GetHex());
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      *tx_hex_string = CreateString(tx->GetHex());
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}